

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseEndLabelOpt(WastParser *this,string *begin_label)

{
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  pointer __s1;
  Location loc_00;
  undefined8 uVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  undefined7 uVar6;
  Result RVar7;
  int iVar8;
  Enum EVar9;
  undefined8 in_R8;
  undefined8 in_R9;
  Location loc;
  string end_label;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Token local_68;
  
  GetToken(&local_68,this);
  uVar6 = local_68.loc.field_1.field_1.offset._1_7_;
  pcVar5 = local_68.loc.filename._M_str;
  sVar3 = local_68.loc.filename._M_len;
  uVar2 = CONCAT71(local_68.loc.field_1.field_1.offset._1_7_,local_68.loc.field_1.field2[0]);
  paVar1 = &local_68.loc.field_1;
  local_68.loc.filename._M_str = (char *)0x0;
  local_68.loc.field_1.field2[0] = 0;
  local_68.loc.filename._M_len = (size_t)paVar1;
  RVar7 = ParseLabelOpt(this,(string *)&local_68);
  sVar4 = local_68.loc.filename._M_len;
  EVar9 = Error;
  if (RVar7.enum_ != Error) {
    EVar9 = Ok;
    if (local_68.loc.filename._M_str != (char *)0x0) {
      local_78 = (undefined4)uVar2;
      uStack_74 = (undefined4)((uint7)uVar6 >> 0x18);
      uStack_70 = (undefined4)local_68.loc.field_1._8_8_;
      uStack_6c = (undefined4)((ulong)local_68.loc.field_1._8_8_ >> 0x20);
      uStack_80 = SUB84(pcVar5,0);
      uStack_7c = (undefined4)((ulong)pcVar5 >> 0x20);
      if ((char *)begin_label->_M_string_length == (char *)0x0) {
        EVar9 = Ok;
        Error(this,0x1f77ce,(char *)local_68.loc.filename._M_len);
      }
      else {
        __s1 = (begin_label->_M_dataplus)._M_p;
        if ((char *)begin_label->_M_string_length == local_68.loc.filename._M_str) {
          iVar8 = bcmp(__s1,(void *)local_68.loc.filename._M_len,
                       (size_t)local_68.loc.filename._M_str);
          EVar9 = Ok;
          if (iVar8 == 0) goto LAB_0019a4b1;
        }
        EVar9 = Ok;
        loc_00.filename._M_str._0_4_ = uStack_80;
        loc_00.filename._M_len = sVar3;
        loc_00.filename._M_str._4_4_ = uStack_7c;
        loc_00.field_1.field_0.line = local_78;
        loc_00.field_1.field_0.first_column = uStack_74;
        loc_00.field_1.field_0.last_column = uStack_70;
        loc_00.field_1._12_4_ = uStack_6c;
        Error(this,loc_00,"mismatching label \"%s\" != \"%s\"",__s1,sVar4,in_R8,in_R9);
      }
    }
  }
LAB_0019a4b1:
  if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_68.loc.filename._M_len != paVar1) {
    operator_delete((void *)local_68.loc.filename._M_len,
                    CONCAT71(local_68.loc.field_1.field_1.offset._1_7_,
                             local_68.loc.field_1.field2[0]) + 1);
  }
  return (Result)EVar9;
}

Assistant:

Result WastParser::ParseEndLabelOpt(const std::string& begin_label) {
  WABT_TRACE(ParseEndLabelOpt);
  Location loc = GetLocation();
  std::string end_label;
  CHECK_RESULT(ParseLabelOpt(&end_label));
  if (!end_label.empty()) {
    if (begin_label.empty()) {
      Error(loc, "unexpected label \"%s\"", end_label.c_str());
    } else if (begin_label != end_label) {
      Error(loc, "mismatching label \"%s\" != \"%s\"", begin_label.c_str(),
            end_label.c_str());
    }
  }
  return Result::Ok;
}